

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void helper_vpmsumw_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  uint64_t uStack_28;
  uint64_t prod [4];
  
  for (uVar1 = 3; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    prod[(ulong)uVar1 - 1] = 0;
    uVar2 = a->u32[uVar1];
    uVar4 = 0;
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
      if (((uint)(1L << ((byte)lVar3 & 0x3f)) & uVar2) != 0) {
        uVar4 = uVar4 ^ (ulong)b->u32[uVar1] << ((byte)lVar3 & 0x3f);
        prod[(ulong)uVar1 - 1] = uVar4;
      }
    }
  }
  uVar2 = 3;
  for (uVar1 = 1; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    r->u64[uVar1] = prod[(ulong)uVar2 - 1] ^ prod[(ulong)(uVar2 - 1) - 1];
    uVar2 = uVar2 - 2;
  }
  return;
}

Assistant:

void helper_vpmsumd(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{

#ifdef CONFIG_INT128
    int i, j;
    __uint128_t prod[2];

    VECTOR_FOR_INORDER_I(i, u64) {
        prod[i] = 0;
        for (j = 0; j < 64; j++) {
            if (a->u64[i] & (1ull << j)) {
                prod[i] ^= (((__uint128_t)b->u64[i]) << j);
            }
        }
    }

    r->u128 = prod[0] ^ prod[1];

#else
    int i, j;
    ppc_avr_t prod[2];

    VECTOR_FOR_INORDER_I(i, u64) {
        prod[i].VsrD(1) = prod[i].VsrD(0) = 0;
        for (j = 0; j < 64; j++) {
            if (a->u64[i] & (1ull << j)) {
                ppc_avr_t bshift;
                if (j == 0) {
                    bshift.VsrD(0) = 0;
                    bshift.VsrD(1) = b->u64[i];
                } else {
                    bshift.VsrD(0) = b->u64[i] >> (64 - j);
                    bshift.VsrD(1) = b->u64[i] << j;
                }
                prod[i].VsrD(1) ^= bshift.VsrD(1);
                prod[i].VsrD(0) ^= bshift.VsrD(0);
            }
        }
    }

    r->VsrD(1) = prod[0].VsrD(1) ^ prod[1].VsrD(1);
    r->VsrD(0) = prod[0].VsrD(0) ^ prod[1].VsrD(0);
#endif
}